

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

duckdb_state
duckdb_execute_prepared_streaming
          (duckdb_prepared_statement prepared_statement,duckdb_result *out_result)

{
  bool bVar1;
  duckdb_state dVar2;
  pointer pPVar3;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_30;
  element_type *local_28;
  
  dVar2 = DuckDBError;
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar3 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(pPVar3);
    if (!bVar1) {
      pPVar3 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                             *)(prepared_statement + 0x38));
      duckdb::PreparedStatement::Execute
                ((PreparedStatement *)&stack0xffffffffffffffd8,
                 (case_insensitive_map_t<BoundParameterData> *)pPVar3,SUB81(prepared_statement,0));
      local_30._M_head_impl = (QueryResult *)local_28;
      local_28 = (element_type *)0x0;
      dVar2 = duckdb::DuckDBTranslateResult
                        ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)&local_30,out_result);
      if ((element_type *)local_30._M_head_impl != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((((weak_ptr<duckdb::ClientContext,_true> *)
                            &((local_30._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult)
                           ->internal).
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi
        )();
      }
      local_30._M_head_impl = (QueryResult *)0x0;
      if (local_28 != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(((local_28->super_enable_shared_from_this<duckdb::ClientContext>).
                            __weak_this_.internal.
                            super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).
                          __weak_this_ + 8))->_M_pi)();
      }
    }
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_execute_prepared_streaming(duckdb_prepared_statement prepared_statement,
                                               duckdb_result *out_result) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}

	auto result = wrapper->statement->Execute(wrapper->values, true);
	return DuckDBTranslateResult(std::move(result), out_result);
}